

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwapIJ.c
# Opt level: O0

void swap_ij(word *f,int totalVars,int varI,int varJ)

{
  int varJ_local;
  int varI_local;
  int totalVars_local;
  word *f_local;
  
  if (varI != varJ) {
    if (varJ < varI) {
      swap_ij(f,totalVars,varJ,varI);
    }
    else if ((varI < 5) && (varJ < 6)) {
      swap_ij_case1(f,totalVars,varI,varJ);
    }
    else if ((varI < 6) && (5 < varJ)) {
      swap_ij_case2(f,totalVars,varI,varJ);
    }
    else if ((5 < varI) && (5 < varJ)) {
      swap_ij_case3(f,totalVars,varI,varJ);
    }
  }
  return;
}

Assistant:

void swap_ij( word* f,int totalVars, int varI, int varJ)
{
    if (varI == varJ)
        return;
    else if(varI>varJ)
        swap_ij( f,totalVars,varJ,varI);
    else if((varI <= 4) && (varJ <= 5))
        swap_ij_case1(f,totalVars, varI, varJ);
    else if((varI <= 5) && (varJ > 5))
        swap_ij_case2(f,totalVars, varI, varJ);
    else if((varI > 5) && (varJ > 5))
        swap_ij_case3(f,totalVars,varI,varJ);
}